

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadType(BinaryReader *this,Type *out_value,char *desc)

{
  Type TVar1;
  Result RVar2;
  Enum EVar3;
  uint32_t type;
  uint32_t heap_type;
  Index IStack_24;
  
  type = 0;
  RVar2 = ReadS32Leb128(this,&type,desc);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    if (type == 0xffffffeb) {
      heap_type = 0;
      RVar2 = ReadS32Leb128(this,&heap_type,desc);
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      *out_value = (Type)((ulong)heap_type << 0x20 | 0xffffffeb);
    }
    else {
      Type::Type((Type *)&heap_type,type);
      TVar1.type_index_ = IStack_24;
      TVar1.enum_ = heap_type;
      *out_value = TVar1;
    }
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::ReadType(Type* out_value, const char* desc) {
  uint32_t type = 0;
  CHECK_RESULT(ReadS32Leb128(&type, desc));
  if (static_cast<Type::Enum>(type) == Type::Reference) {
    uint32_t heap_type = 0;
    CHECK_RESULT(ReadS32Leb128(&heap_type, desc));
    *out_value = Type(Type::Reference, heap_type);
  } else {
    *out_value = static_cast<Type>(type);
  }
  return Result::Ok;
}